

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# construct.cpp
# Opt level: O0

bool __thiscall
spvtools::val::Construct::IsStructuredExit(Construct *this,ValidationState_t *_,BasicBlock *dest)

{
  bool bVar1;
  ConstructType CVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  Op OVar6;
  BasicBlock *pBVar7;
  Instruction *pIVar8;
  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_> *pvVar9;
  const_reference pvVar10;
  vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *this_00;
  const_reference ppCVar11;
  Instruction *this_01;
  Function *this_02;
  pair<const_spvtools::val::BasicBlock_*,_bool> pVar12;
  uint continue_target;
  BasicBlock *merge_block;
  uint merge_target;
  value_type *merge_inst_2;
  long index_2;
  Instruction *terminator_2;
  BasicBlock *block;
  BasicBlock *header_2;
  bool seen_switch;
  anon_class_1_0_00000001 NextBlock;
  const_reference pvStack_78;
  uint merge_block_id_1;
  value_type *merge_inst_1;
  long index_1;
  Instruction *terminator_1;
  BasicBlock *header_1;
  value_type loop_construct;
  uint continue_block_id;
  uint merge_block_id;
  value_type *merge_inst;
  long index;
  Instruction *terminator;
  BasicBlock *header;
  BasicBlock *dest_local;
  ValidationState_t *__local;
  Construct *this_local;
  
  CVar2 = type(this);
  if (CVar2 == kCase) {
    __assert_fail("type() != ConstructType::kCase",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/construct.cpp"
                  ,0x86,
                  "bool spvtools::val::Construct::IsStructuredExit(ValidationState_t &, BasicBlock *) const"
                 );
  }
  CVar2 = type(this);
  if (CVar2 == kLoop) {
    pBVar7 = entry_block(this);
    pIVar8 = BasicBlock::terminator(pBVar7);
    pvVar9 = ValidationState_t::ordered_instructions(_);
    pvVar10 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
              operator[](pvVar9,0);
    pvVar9 = ValidationState_t::ordered_instructions(_);
    pvVar10 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
              operator[](pvVar9,((long)pIVar8 - (long)pvVar10) / 0x88 - 1);
    uVar3 = Instruction::GetOperandAs<unsigned_int>(pvVar10,0);
    uVar4 = Instruction::GetOperandAs<unsigned_int>(pvVar10,1);
    uVar5 = BasicBlock::id(dest);
    if ((uVar5 == uVar3) || (uVar5 = BasicBlock::id(dest), uVar5 == uVar4)) {
      return true;
    }
  }
  else {
    CVar2 = type(this);
    if (CVar2 == kContinue) {
      this_00 = corresponding_constructs(this);
      ppCVar11 = std::
                 vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
                 operator[](this_00,0);
      pBVar7 = entry_block(*ppCVar11);
      pIVar8 = BasicBlock::terminator(pBVar7);
      pvVar9 = ValidationState_t::ordered_instructions(_);
      pvVar10 = std::vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ::operator[](pvVar9,0);
      pvVar9 = ValidationState_t::ordered_instructions(_);
      pvStack_78 = std::
                   vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                   operator[](pvVar9,((long)pIVar8 - (long)pvVar10) / 0x88 - 1);
      header_2._4_4_ = Instruction::GetOperandAs<unsigned_int>(pvStack_78,0);
      if ((dest == pBVar7) || (uVar5 = BasicBlock::id(dest), uVar5 == header_2._4_4_)) {
        return true;
      }
    }
    else {
      CVar2 = type(this);
      if (CVar2 != kSelection) {
        __assert_fail("type() == ConstructType::kSelection",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/construct.cpp"
                      ,0x9c,
                      "bool spvtools::val::Construct::IsStructuredExit(ValidationState_t &, BasicBlock *) const"
                     );
      }
      pBVar7 = exit_block(this);
      if (dest == pBVar7) {
        return true;
      }
      header_2._2_1_ = 0;
      pBVar7 = entry_block(this);
      terminator_2 = (Instruction *)
                     IsStructuredExit::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)((long)&header_2 + 3),pBVar7);
      while (terminator_2 != (Instruction *)0x0) {
        pIVar8 = BasicBlock::terminator((BasicBlock *)terminator_2);
        pvVar9 = ValidationState_t::ordered_instructions(_);
        pvVar10 = std::
                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                  operator[](pvVar9,0);
        pvVar9 = ValidationState_t::ordered_instructions(_);
        pvVar10 = std::
                  vector<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>::
                  operator[](pvVar9,((long)pIVar8 - (long)pvVar10) / 0x88 - 1);
        OVar6 = Instruction::opcode(pvVar10);
        if (OVar6 == OpLoopMerge) {
LAB_002f9939:
          uVar3 = Instruction::GetOperandAs<unsigned_int>(pvVar10,0);
          this_02 = Instruction::function(pvVar10);
          pVar12 = Function::GetBlock(this_02,uVar3);
          bVar1 = BasicBlock::structurally_dominates(pVar12.first,pBVar7);
          if (!bVar1) {
            if ((((header_2._2_1_ & 1) == 0) ||
                (OVar6 = Instruction::opcode(pvVar10), OVar6 == OpLoopMerge)) &&
               (uVar5 = BasicBlock::id(dest), uVar5 == uVar3)) {
              return true;
            }
            OVar6 = Instruction::opcode(pvVar10);
            if (OVar6 == OpLoopMerge) {
              uVar3 = Instruction::GetOperandAs<unsigned_int>(pvVar10,1);
              uVar5 = BasicBlock::id(dest);
              if (uVar5 == uVar3) {
                return true;
              }
            }
            OVar6 = Instruction::opcode(pIVar8);
            if (OVar6 == OpSwitch) {
              header_2._2_1_ = 1;
            }
            OVar6 = Instruction::opcode(pvVar10);
            if (OVar6 == OpLoopMerge) {
              return false;
            }
            goto LAB_002f9a7a;
          }
          terminator_2 = (Instruction *)
                         IsStructuredExit::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)((long)&header_2 + 3),
                                    (BasicBlock *)terminator_2);
        }
        else {
          this_01 = BasicBlock::terminator(pBVar7);
          OVar6 = Instruction::opcode(this_01);
          if (((OVar6 != OpSwitch) &&
              (OVar6 = Instruction::opcode(pvVar10), OVar6 == OpSelectionMerge)) &&
             (OVar6 = Instruction::opcode(pIVar8), OVar6 == OpSwitch)) goto LAB_002f9939;
LAB_002f9a7a:
          terminator_2 = (Instruction *)
                         IsStructuredExit::anon_class_1_0_00000001::operator()
                                   ((anon_class_1_0_00000001 *)((long)&header_2 + 3),
                                    (BasicBlock *)terminator_2);
        }
      }
    }
  }
  return false;
}

Assistant:

bool Construct::IsStructuredExit(ValidationState_t& _, BasicBlock* dest) const {
  // Structured Exits:
  // - Selection:
  //  - branch to its merge
  //  - branch to nearest enclosing loop merge or continue
  //  - branch to nearest enclosing switch selection merge
  // - Loop:
  //  - branch to its merge
  //  - branch to its continue
  // - Continue:
  //  - branch to loop header
  //  - branch to loop merge
  //
  // Note: we will never see a case construct here.
  assert(type() != ConstructType::kCase);
  if (type() == ConstructType::kLoop) {
    auto header = entry_block();
    auto terminator = header->terminator();
    auto index = terminator - &_.ordered_instructions()[0];
    auto merge_inst = &_.ordered_instructions()[index - 1];
    auto merge_block_id = merge_inst->GetOperandAs<uint32_t>(0u);
    auto continue_block_id = merge_inst->GetOperandAs<uint32_t>(1u);
    if (dest->id() == merge_block_id || dest->id() == continue_block_id) {
      return true;
    }
  } else if (type() == ConstructType::kContinue) {
    auto loop_construct = corresponding_constructs()[0];
    auto header = loop_construct->entry_block();
    auto terminator = header->terminator();
    auto index = terminator - &_.ordered_instructions()[0];
    auto merge_inst = &_.ordered_instructions()[index - 1];
    auto merge_block_id = merge_inst->GetOperandAs<uint32_t>(0u);
    if (dest == header || dest->id() == merge_block_id) {
      return true;
    }
  } else {
    assert(type() == ConstructType::kSelection);
    if (dest == exit_block()) {
      return true;
    }

    // The next block in the traversal is either:
    //  i.  The header block that declares |block| as its merge block.
    //  ii. The immediate dominator of |block|.
    auto NextBlock = [](const BasicBlock* block) -> const BasicBlock* {
      for (auto& use : block->label()->uses()) {
        if ((use.first->opcode() == spv::Op::OpLoopMerge ||
             use.first->opcode() == spv::Op::OpSelectionMerge) &&
            use.second == 1 &&
            use.first->block()->structurally_dominates(*block) &&
            // A header likely declared itself as its merge.
            use.first->block() != block) {
          return use.first->block();
        }
      }
      return block->immediate_structural_dominator();
    };

    bool seen_switch = false;
    auto header = entry_block();
    auto block = NextBlock(header);
    while (block) {
      auto terminator = block->terminator();
      auto index = terminator - &_.ordered_instructions()[0];
      auto merge_inst = &_.ordered_instructions()[index - 1];
      if (merge_inst->opcode() == spv::Op::OpLoopMerge ||
          (header->terminator()->opcode() != spv::Op::OpSwitch &&
           merge_inst->opcode() == spv::Op::OpSelectionMerge &&
           terminator->opcode() == spv::Op::OpSwitch)) {
        auto merge_target = merge_inst->GetOperandAs<uint32_t>(0u);
        auto merge_block = merge_inst->function()->GetBlock(merge_target).first;
        if (merge_block->structurally_dominates(*header)) {
          block = NextBlock(block);
          continue;
        }

        if ((!seen_switch || merge_inst->opcode() == spv::Op::OpLoopMerge) &&
            dest->id() == merge_target) {
          return true;
        } else if (merge_inst->opcode() == spv::Op::OpLoopMerge) {
          auto continue_target = merge_inst->GetOperandAs<uint32_t>(1u);
          if (dest->id() == continue_target) {
            return true;
          }
        }

        if (terminator->opcode() == spv::Op::OpSwitch) {
          seen_switch = true;
        }

        // Hit an enclosing loop and didn't break or continue.
        if (merge_inst->opcode() == spv::Op::OpLoopMerge) return false;
      }

      block = NextBlock(block);
    }
  }

  return false;
}